

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::draw_line_numbers(Fl_Text_Display *this,bool param_1)

{
  int h;
  int iVar1;
  int iVar2;
  uint uVar3;
  Fl_Boxtype FVar4;
  int iVar5;
  Fl_Align FVar6;
  Fl_Color FVar7;
  Fl_Color c;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  Fl_Font face;
  Fl_Fontsize fsize;
  Fl_Text_Buffer *this_00;
  char *__format;
  Fl_Color local_84;
  int local_7c;
  int local_74;
  int hh;
  int ww;
  int yy;
  int xx;
  Fl_Color bgcolor;
  Fl_Color fgcolor;
  int yoff;
  int xoff;
  int hscroll_h;
  int isactive;
  int lineHeight;
  char lineNumString [16];
  int local_20;
  int lineStart;
  int visLine;
  int line;
  int Y;
  bool param_1_local;
  Fl_Text_Display *this_local;
  
  h = this->mMaxsize;
  iVar1 = Fl_Widget::active_r((Fl_Widget *)this);
  if ((0 < this->mLineNumWidth) && (iVar2 = Fl_Widget::visible_r((Fl_Widget *)this), iVar2 != 0)) {
    uVar3 = Fl_Widget::visible((Fl_Widget *)this->mHScrollBar);
    if (uVar3 == 0) {
      local_74 = 0;
    }
    else {
      local_74 = Fl_Widget::h((Fl_Widget *)this->mHScrollBar);
    }
    FVar4 = Fl_Widget::box((Fl_Widget *)this);
    iVar2 = Fl::box_dx(FVar4);
    FVar4 = Fl_Widget::box((Fl_Widget *)this);
    iVar5 = Fl::box_dy(FVar4);
    FVar6 = scrollbar_align(this);
    if ((FVar6 & 1) == 0) {
      local_7c = 0;
    }
    else {
      local_7c = local_74;
    }
    if (iVar1 == 0) {
      FVar7 = linenumber_fgcolor(this);
      FVar7 = fl_inactive(FVar7);
      c = linenumber_bgcolor(this);
      local_84 = fl_inactive(c);
    }
    else {
      FVar7 = linenumber_fgcolor(this);
      local_84 = linenumber_bgcolor(this);
    }
    iVar8 = Fl_Widget::x((Fl_Widget *)this);
    iVar9 = Fl_Widget::y((Fl_Widget *)this);
    iVar1 = this->mLineNumWidth;
    iVar10 = Fl_Widget::h((Fl_Widget *)this);
    FVar4 = Fl_Widget::box((Fl_Widget *)this);
    iVar11 = Fl::box_dw(FVar4);
    fl_push_clip(iVar8 + iVar2,iVar9 + iVar5 + local_7c,iVar1,(iVar10 - iVar11) - local_74);
    fl_color(local_84);
    iVar8 = Fl_Widget::x((Fl_Widget *)this);
    iVar9 = Fl_Widget::y((Fl_Widget *)this);
    iVar1 = this->mLineNumWidth;
    iVar10 = Fl_Widget::h((Fl_Widget *)this);
    fl_rectf(iVar8 + iVar2,iVar9,iVar1,iVar10);
    face = linenumber_font(this);
    fsize = linenumber_size(this);
    fl_font(face,fsize);
    iVar1 = Fl_Widget::y((Fl_Widget *)this);
    visLine = iVar1 + iVar5 + local_7c;
    lineStart = get_absolute_top_line_number(this);
    fl_color(FVar7);
    for (local_20 = 0; local_20 < this->mNVisibleLines; local_20 = local_20 + 1) {
      lineNumString._12_4_ = this->mLineStarts[local_20];
      if (lineNumString._12_4_ == -1) {
LAB_0022517e:
        if (local_20 == 0) {
          lineStart = lineStart + 1;
        }
      }
      else {
        if (lineNumString._12_4_ != 0) {
          this_00 = buffer(this);
          uVar3 = Fl_Text_Buffer::char_at(this_00,lineNumString._12_4_ + -1);
          if (uVar3 != 10) goto LAB_0022517e;
        }
        __format = linenumber_format(this);
        sprintf((char *)&isactive,__format,(ulong)(uint)lineStart);
        iVar5 = Fl_Widget::x((Fl_Widget *)this);
        iVar1 = this->mLineNumWidth;
        FVar6 = linenumber_align(this);
        fl_draw((char *)&isactive,iVar5 + iVar2 + 3,visLine + 3,iVar1 + -6,h,FVar6,(Fl_Image *)0x0,0
               );
        lineStart = lineStart + 1;
      }
      visLine = h + visLine;
    }
    fl_pop_clip();
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_line_numbers(bool /*clearAll*/) {
  int Y, line, visLine, lineStart;
  char lineNumString[16];
  int lineHeight = mMaxsize;
  int isactive = active_r() ? 1 : 0;

  // Don't draw if lineNumWidth == 0 (line numbers are hidden),
  // or widget is not yet realized
  if (mLineNumWidth <= 0 || !visible_r())
    return;

  // Make sure we set the correct clipping range for line numbers.
  // Take scrollbars and positions into account.
  int hscroll_h = mHScrollBar->visible() ? mHScrollBar->h() : 0;
  int xoff = Fl::box_dx(box());
  int yoff = Fl::box_dy(box()) + ((scrollbar_align()&FL_ALIGN_TOP)?hscroll_h:0);

#ifndef LINENUM_LEFT_OF_VSCROLL
  int vscroll_w = mVScrollBar->visible() ? mVScrollBar->w() : 0;
  if (scrollbar_align()&FL_ALIGN_LEFT)
    xoff += vscroll_w;
#endif

  Fl_Color fgcolor = isactive ? linenumber_fgcolor() : fl_inactive(linenumber_fgcolor());
  Fl_Color bgcolor = isactive ? linenumber_bgcolor() : fl_inactive(linenumber_bgcolor());
  fl_push_clip(x() + xoff,
               y() + yoff,
               mLineNumWidth,
               h() - Fl::box_dw(box()) - hscroll_h);
  {
    // Set background color for line number area -- LZA / STR# 2621
    // Erase background
    fl_color(bgcolor);
    fl_rectf(x()+xoff, y(), mLineNumWidth, h());

    // Draw separator line
    //fl_color(180,180,180);
    //fl_line(x()+mLineNumWidth-1, y(), x()+mLineNumWidth-1, y()+h());

    // Draw line number text
    fl_font(linenumber_font(), linenumber_size());

    Y = y() + yoff;
    line = get_absolute_top_line_number();

    // set font color for line numbers
    fl_color(fgcolor);
    for (visLine=0; visLine < mNVisibleLines; visLine++) {
      lineStart = mLineStarts[visLine];
      if (lineStart != -1 && (lineStart==0 || buffer()->char_at(lineStart-1)=='\n')) {
	sprintf(lineNumString, linenumber_format(), line);
	int xx = x() + xoff + 3,
	    yy = Y + 3,
	    ww = mLineNumWidth - (3*2),
	    hh = lineHeight;
	fl_draw(lineNumString, xx, yy, ww, hh, linenumber_align(), 0, 0);
	//DEBUG fl_rect(xx, yy, ww, hh);
	line++;
      } else {
	if (visLine == 0) line++;
      }
      Y += lineHeight;
    }
  } 
  fl_pop_clip();
}